

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkPtrmap(IntegrityCk *pCheck,Pgno iChild,u8 eType,Pgno iParent)

{
  uint local_28;
  byte local_21;
  Pgno iPtrmapParent;
  Pgno PStack_1c;
  u8 ePtrmapType;
  int rc;
  Pgno iParent_local;
  u8 eType_local;
  IntegrityCk *pIStack_10;
  Pgno iChild_local;
  IntegrityCk *pCheck_local;
  
  PStack_1c = iParent;
  rc._3_1_ = eType;
  iParent_local = iChild;
  pIStack_10 = pCheck;
  iPtrmapParent = ptrmapGet(pCheck->pBt,iChild,&local_21,&local_28);
  if (iPtrmapParent == 0) {
    if ((local_21 != rc._3_1_) || (local_28 != PStack_1c)) {
      checkAppendMsg(pIStack_10,"Bad ptr map entry key=%d expected=(%d,%d) got=(%d,%d)",
                     (ulong)iParent_local,(ulong)rc._3_1_,(ulong)PStack_1c,(ulong)local_21,local_28)
      ;
    }
  }
  else {
    if ((iPtrmapParent == 7) || (iPtrmapParent == 0xc0a)) {
      pIStack_10->mallocFailed = 1;
    }
    checkAppendMsg(pIStack_10,"Failed to read ptrmap key=%d",(ulong)iParent_local);
  }
  return;
}

Assistant:

static void checkPtrmap(
  IntegrityCk *pCheck,   /* Integrity check context */
  Pgno iChild,           /* Child page number */
  u8 eType,              /* Expected pointer map type */
  Pgno iParent           /* Expected pointer map parent page number */
){
  int rc;
  u8 ePtrmapType;
  Pgno iPtrmapParent;

  rc = ptrmapGet(pCheck->pBt, iChild, &ePtrmapType, &iPtrmapParent);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ) pCheck->mallocFailed = 1;
    checkAppendMsg(pCheck, "Failed to read ptrmap key=%d", iChild);
    return;
  }

  if( ePtrmapType!=eType || iPtrmapParent!=iParent ){
    checkAppendMsg(pCheck,
      "Bad ptr map entry key=%d expected=(%d,%d) got=(%d,%d)", 
      iChild, eType, iParent, ePtrmapType, iPtrmapParent);
  }
}